

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::SetOneof2<proto2_unittest::TestOneof2>(TestOneof2 *message)

{
  uint32_t *puVar1;
  Arena *arena;
  TestOneof2 *message_local;
  
  proto2_unittest::TestOneof2::set_foo_int(message,200);
  proto2_unittest::TestOneof2::set_bar_enum(message,TestOneof2_NestedEnum_BAZ);
  proto2_unittest::TestOneof2::set_baz_int(message,0xca);
  puVar1 = internal::HasBits<1>::operator[](&(message->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)message);
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.baz_string_,"203",arena);
  return;
}

Assistant:

void SetOneof2(TestOneof2* message) {
  message->set_foo_int(200);
  message->set_bar_enum(TestOneof2::BAZ);
  message->set_baz_int(202);
  message->set_baz_string("203");
}